

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_subset(bcf_hdr_t *h,bcf1_t *v,int n,int *imap)

{
  int32_t x;
  int iVar1;
  int iVar2;
  int l;
  undefined8 uVar3;
  long lVar4;
  char *__ptr;
  ulong uVar5;
  bcf_fmt_t *ptr_00;
  bcf_fmt_t *fmt_00;
  undefined1 *puVar6;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  int32_t *local_60;
  bcf_fmt_t *f;
  uint8_t *ptr;
  int j;
  int i;
  bcf_fmt_t *fmt;
  kstring_t ind;
  int *imap_local;
  int n_local;
  bcf1_t *v_local;
  bcf_hdr_t *h_local;
  
  puVar6 = auStack_68;
  ind.m = 0;
  ind.l = 0;
  fmt = (bcf_fmt_t *)0x0;
  ind.s = (char *)imap;
  if (n == 0) {
    *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffffff;
  }
  else {
    uVar5 = (ulong)(byte)v->field_0x14;
    puVar6 = auStack_68 + uVar5 * -0x20;
    f = (bcf_fmt_t *)(v->indiv).s;
    _j = puVar6;
    for (ptr._4_4_ = 0; ptr_00 = f,
        (int)ptr._4_4_ < (int)((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x20) & 0xff);
        ptr._4_4_ = ptr._4_4_ + 1) {
      uVar3 = *(undefined8 *)&v->field_0x10;
      fmt_00 = (bcf_fmt_t *)(_j + (long)(int)ptr._4_4_ * 0x20);
      (&uStack_70)[uVar5 * -4] = 0x128466;
      f = (bcf_fmt_t *)bcf_unpack_fmt_core1((uint8_t *)ptr_00,(uint)((ulong)uVar3 >> 0x28),fmt_00);
    }
    for (ptr._4_4_ = 0;
        (int)ptr._4_4_ < (int)((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x20) & 0xff);
        ptr._4_4_ = ptr._4_4_ + 1) {
      local_60 = (int32_t *)(_j + (long)(int)ptr._4_4_ * 0x20);
      x = *local_60;
      (&uStack_70)[uVar5 * -4] = 0x1284bc;
      bcf_enc_int1((kstring_t *)&fmt,x);
      iVar1 = local_60[1];
      iVar2 = local_60[3];
      (&uStack_70)[uVar5 * -4] = 0x1284d3;
      bcf_enc_size((kstring_t *)&fmt,iVar1,iVar2);
      for (ptr._0_4_ = 0; (int)ptr < n; ptr._0_4_ = (int)ptr + 1) {
        if (-1 < *(int *)(ind.s + (long)(int)ptr * 4)) {
          lVar4 = *(long *)(local_60 + 4);
          iVar1 = *(int *)(ind.s + (long)(int)ptr * 4);
          iVar2 = local_60[2];
          l = local_60[2];
          (&uStack_70)[uVar5 * -4] = 0x128520;
          kputsn((char *)(lVar4 + iVar1 * iVar2),l,(kstring_t *)&fmt);
        }
      }
    }
    ptr._4_4_ = 0;
    for (ptr._0_4_ = 0; (int)ptr < n; ptr._0_4_ = (int)ptr + 1) {
      if (-1 < *(int *)(ind.s + (long)(int)ptr * 4)) {
        ptr._4_4_ = ptr._4_4_ + 1;
      }
    }
    *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffffff | (ulong)ptr._4_4_ << 0x28;
  }
  if ((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x28) == 0) {
    *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffff00ffffffff;
  }
  __ptr = (v->indiv).s;
  *(undefined8 *)(puVar6 + -8) = 0x1285f9;
  free(__ptr);
  (v->indiv).l = (size_t)fmt;
  (v->indiv).m = ind.l;
  (v->indiv).s = (char *)ind.m;
  v->unpacked = v->unpacked & 0xfffffff7;
  return 0;
}

Assistant:

int bcf_subset(const bcf_hdr_t *h, bcf1_t *v, int n, int *imap)
{
    kstring_t ind;
    ind.s = 0; ind.l = ind.m = 0;
    if (n) {
        bcf_fmt_t *fmt;
        int i, j;
        fmt = (bcf_fmt_t*)alloca(v->n_fmt * sizeof(bcf_fmt_t));
        uint8_t *ptr = (uint8_t*)v->indiv.s;
        for (i = 0; i < v->n_fmt; ++i)
            ptr = bcf_unpack_fmt_core1(ptr, v->n_sample, &fmt[i]);
        for (i = 0; i < (int)v->n_fmt; ++i) {
            bcf_fmt_t *f = &fmt[i];
            bcf_enc_int1(&ind, f->id);
            bcf_enc_size(&ind, f->n, f->type);
            for (j = 0; j < n; ++j)
                if (imap[j] >= 0) kputsn((char*)(f->p + imap[j] * f->size), f->size, &ind);
        }
        for (i = j = 0; j < n; ++j) if (imap[j] >= 0) ++i;
        v->n_sample = i;
    } else v->n_sample = 0;
    if ( !v->n_sample ) v->n_fmt = 0;
    free(v->indiv.s);
    v->indiv = ind;
    v->unpacked &= ~BCF_UN_FMT;    // only BCF is ready for output, VCF will need to unpack again
    return 0;
}